

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.h
# Opt level: O0

void __thiscall HttpData::~HttpData(HttpData *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  close((int)in_RDI[1]._M_string_length);
  std::weak_ptr<TimerNode>::~weak_ptr((weak_ptr<TimerNode> *)0x11cc4e);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x11cc5f);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)0x11ccab);
  std::enable_shared_from_this<HttpData>::~enable_shared_from_this
            ((enable_shared_from_this<HttpData> *)0x11ccb5);
  return;
}

Assistant:

~HttpData() { close(fd_); }